

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilereaderEms.cpp
# Opt level: O0

FilereaderRetcode __thiscall
FilereaderEms::readModelFromFile
          (FilereaderEms *this,HighsOptions *options,string *filename,HighsModel *model)

{
  byte bVar1;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  string *psVar6;
  reference pvVar7;
  int *in_RCX;
  _Ios_Openmode in_EDX;
  long in_RSI;
  HighsInt iCol;
  bool indices_from_one;
  HighsInt num_int;
  HighsInt AcountX;
  HighsInt numRow;
  HighsInt numCol;
  string line;
  HighsLp *lp;
  HighsInt i;
  ifstream f;
  string *in_stack_fffffffffffffbb8;
  undefined7 in_stack_fffffffffffffbc0;
  undefined1 in_stack_fffffffffffffbc7;
  size_type in_stack_fffffffffffffbd8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffbe0;
  undefined7 in_stack_fffffffffffffbe8;
  undefined1 in_stack_fffffffffffffbef;
  vector<HighsVarType,_std::allocator<HighsVarType>_> *in_stack_fffffffffffffbf0;
  bool local_3d2;
  bool local_3b2;
  bool local_2e2;
  int local_2a8;
  undefined1 local_2a1;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined8 local_290;
  int local_288;
  byte local_281;
  int local_280;
  int local_27c;
  int local_278;
  int local_274;
  string local_270 [48];
  int *local_240;
  int local_234;
  istream local_230;
  int *local_28;
  long local_18;
  FilereaderRetcode local_4;
  
  local_28 = in_RCX;
  local_18 = in_RSI;
  std::ifstream::ifstream(&local_230);
  local_240 = local_28;
  std::ifstream::open((string *)&local_230,in_EDX);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    highsLogUser((HighsLogOptions *)(local_18 + 0x380),kError,"EMS file not found\n");
    local_4 = kFileNotFound;
    local_288 = 1;
  }
  else {
    std::__cxx11::string::string(local_270);
    local_281 = 0;
    std::getline<char,std::char_traits<char>,std::allocator<char>>(&local_230,local_270);
    trim((string *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
         in_stack_fffffffffffffbb8);
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                            (char *)in_stack_fffffffffffffbb8);
    if (bVar2) {
      while( true ) {
        trim((string *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
             in_stack_fffffffffffffbb8);
        bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                                (char *)in_stack_fffffffffffffbb8);
        local_2e2 = false;
        if (bVar2) {
          local_2e2 = std::ios::operator_cast_to_bool
                                (local_230._vptr_basic_istream[-3] +
                                 (long)&local_230._vptr_basic_istream);
        }
        if (local_2e2 == false) break;
        std::getline<char,std::char_traits<char>,std::allocator<char>>(&local_230,local_270);
      }
      local_281 = 1;
    }
    bVar1 = std::ios::operator!(local_230._vptr_basic_istream[-3] +
                                (long)&local_230._vptr_basic_istream);
    if ((bVar1 & 1) == 0) {
      std::istream::operator>>(&local_230,&local_278);
      std::getline<char,std::char_traits<char>,std::allocator<char>>(&local_230,local_270);
      while( true ) {
        trim((string *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
             in_stack_fffffffffffffbb8);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                                (char *)in_stack_fffffffffffffbb8);
        if (!bVar2) break;
        std::getline<char,std::char_traits<char>,std::allocator<char>>(&local_230,local_270);
      }
      trim((string *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
           in_stack_fffffffffffffbb8);
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                              (char *)in_stack_fffffffffffffbb8);
      if (bVar2) {
        highsLogUser((HighsLogOptions *)(local_18 + 0x380),kError,
                     "n_columns not found in EMS file\n");
        local_4 = kParserError;
        local_288 = 1;
      }
      else {
        std::istream::operator>>(&local_230,&local_274);
        std::getline<char,std::char_traits<char>,std::allocator<char>>(&local_230,local_270);
        while( true ) {
          trim((string *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
               in_stack_fffffffffffffbb8);
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                                  (char *)in_stack_fffffffffffffbb8);
          if (!bVar2) break;
          std::getline<char,std::char_traits<char>,std::allocator<char>>(&local_230,local_270);
        }
        trim((string *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
             in_stack_fffffffffffffbb8);
        bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                                (char *)in_stack_fffffffffffffbb8);
        if (bVar2) {
          highsLogUser((HighsLogOptions *)(local_18 + 0x380),kError,
                       "n_matrix_elements not found in EMS file\n");
          local_4 = kParserError;
          local_288 = 1;
        }
        else {
          std::istream::operator>>(&local_230,&local_27c);
          *local_240 = local_274;
          local_240[1] = local_278;
          std::getline<char,std::char_traits<char>,std::allocator<char>>(&local_230,local_270);
          while( true ) {
            trim((string *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                 in_stack_fffffffffffffbb8);
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0)
                                    ,(char *)in_stack_fffffffffffffbb8);
            if (!bVar2) break;
            std::getline<char,std::char_traits<char>,std::allocator<char>>(&local_230,local_270);
          }
          trim((string *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
               in_stack_fffffffffffffbb8);
          bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                                  (char *)in_stack_fffffffffffffbb8);
          if (bVar2) {
            highsLogUser((HighsLogOptions *)(local_18 + 0x380),kError,
                         "matrix not found in EMS file\n");
            local_4 = kParserError;
            local_288 = 1;
          }
          else {
            local_240[0x20] = 1;
            std::vector<int,_std::allocator<int>_>::resize
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbe0,
                       in_stack_fffffffffffffbd8);
            std::vector<int,_std::allocator<int>_>::resize
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbe0,
                       in_stack_fffffffffffffbd8);
            std::vector<double,_std::allocator<double>_>::resize
                      (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
            for (local_234 = 0; local_234 < local_274 + 1; local_234 = local_234 + 1) {
              pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(local_240 + 0x24),
                                  (long)local_234);
              std::istream::operator>>(&local_230,pvVar3);
              if ((local_281 & 1) != 0) {
                pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)(local_240 + 0x24),
                                    (long)local_234);
                *pvVar3 = *pvVar3 + -1;
              }
            }
            for (local_234 = 0; local_234 < local_27c; local_234 = local_234 + 1) {
              pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(local_240 + 0x30),
                                  (long)local_234);
              std::istream::operator>>(&local_230,pvVar3);
              if ((local_281 & 1) != 0) {
                pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)(local_240 + 0x30),
                                    (long)local_234);
                *pvVar3 = *pvVar3 + -1;
              }
            }
            for (local_234 = 0; local_234 < local_27c; local_234 = local_234 + 1) {
              pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(local_240 + 0x36),
                                  (long)local_234);
              std::istream::operator>>(&local_230,pvVar4);
            }
            std::getline<char,std::char_traits<char>,std::allocator<char>>(&local_230,local_270);
            while( true ) {
              trim((string *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                   in_stack_fffffffffffffbb8);
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT17(in_stack_fffffffffffffbc7,
                                                  in_stack_fffffffffffffbc0),
                                      (char *)in_stack_fffffffffffffbb8);
              if (!bVar2) break;
              std::getline<char,std::char_traits<char>,std::allocator<char>>(&local_230,local_270);
            }
            trim((string *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                 in_stack_fffffffffffffbb8);
            bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0)
                                    ,(char *)in_stack_fffffffffffffbb8);
            if (bVar2) {
              highsLogUser((HighsLogOptions *)(local_18 + 0x380),kError,
                           "column_bounds not found in EMS file\n");
              local_4 = kParserError;
              local_288 = 1;
            }
            else {
              std::vector<double,_std::allocator<double>_>::reserve
                        ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
                         CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8));
              std::vector<double,_std::allocator<double>_>::reserve
                        ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
                         CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8));
              local_290 = 0xfff0000000000000;
              std::vector<double,_std::allocator<double>_>::assign
                        ((vector<double,_std::allocator<double>_> *)
                         CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                         (size_type)in_stack_fffffffffffffbb8,(value_type_conflict1 *)0x447eb5);
              std::vector<double,_std::allocator<double>_>::assign
                        ((vector<double,_std::allocator<double>_> *)
                         CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                         (size_type)in_stack_fffffffffffffbb8,(value_type_conflict1 *)0x447ed7);
              for (local_234 = 0; local_234 < local_274; local_234 = local_234 + 1) {
                pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)(local_240 + 8),
                                    (long)local_234);
                std::istream::operator>>(&local_230,pvVar4);
              }
              for (local_234 = 0; local_234 < local_274; local_234 = local_234 + 1) {
                pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)(local_240 + 0xe),
                                    (long)local_234);
                std::istream::operator>>(&local_230,pvVar4);
              }
              std::getline<char,std::char_traits<char>,std::allocator<char>>(&local_230,local_270);
              while( true ) {
                trim((string *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                     in_stack_fffffffffffffbb8);
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT17(in_stack_fffffffffffffbc7,
                                                    in_stack_fffffffffffffbc0),
                                        (char *)in_stack_fffffffffffffbb8);
                if (!bVar2) break;
                std::getline<char,std::char_traits<char>,std::allocator<char>>(&local_230,local_270)
                ;
              }
              trim((string *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                   in_stack_fffffffffffffbb8);
              bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT17(in_stack_fffffffffffffbc7,
                                                  in_stack_fffffffffffffbc0),
                                      (char *)in_stack_fffffffffffffbb8);
              if (bVar2) {
                highsLogUser((HighsLogOptions *)(local_18 + 0x380),kError,
                             "row_bounds not found in EMS file\n");
                local_4 = kParserError;
                local_288 = 1;
              }
              else {
                std::vector<double,_std::allocator<double>_>::reserve
                          ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
                           CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8));
                std::vector<double,_std::allocator<double>_>::reserve
                          ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
                           CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8));
                local_298 = 0xfff0000000000000;
                std::vector<double,_std::allocator<double>_>::assign
                          ((vector<double,_std::allocator<double>_> *)
                           CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                           (size_type)in_stack_fffffffffffffbb8,(value_type_conflict1 *)0x4480f9);
                std::vector<double,_std::allocator<double>_>::assign
                          ((vector<double,_std::allocator<double>_> *)
                           CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                           (size_type)in_stack_fffffffffffffbb8,(value_type_conflict1 *)0x44811b);
                for (local_234 = 0; local_234 < local_278; local_234 = local_234 + 1) {
                  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                                     ((vector<double,_std::allocator<double>_> *)(local_240 + 0x14),
                                      (long)local_234);
                  std::istream::operator>>(&local_230,pvVar4);
                }
                for (local_234 = 0; local_234 < local_278; local_234 = local_234 + 1) {
                  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                                     ((vector<double,_std::allocator<double>_> *)(local_240 + 0x1a),
                                      (long)local_234);
                  std::istream::operator>>(&local_230,pvVar4);
                }
                std::getline<char,std::char_traits<char>,std::allocator<char>>(&local_230,local_270)
                ;
                while( true ) {
                  trim((string *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                       in_stack_fffffffffffffbb8);
                  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)CONCAT17(in_stack_fffffffffffffbc7,
                                                      in_stack_fffffffffffffbc0),
                                          (char *)in_stack_fffffffffffffbb8);
                  if (!bVar2) break;
                  std::getline<char,std::char_traits<char>,std::allocator<char>>
                            (&local_230,local_270);
                }
                trim((string *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                     in_stack_fffffffffffffbb8);
                bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT17(in_stack_fffffffffffffbc7,
                                                    in_stack_fffffffffffffbc0),
                                        (char *)in_stack_fffffffffffffbb8);
                if (bVar2) {
                  highsLogUser((HighsLogOptions *)(local_18 + 0x380),kError,
                               "column_costs not found in EMS file\n");
                  local_4 = kParserError;
                  local_288 = 1;
                }
                else {
                  std::vector<double,_std::allocator<double>_>::reserve
                            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
                             CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8));
                  local_2a0 = 0;
                  std::vector<double,_std::allocator<double>_>::assign
                            ((vector<double,_std::allocator<double>_> *)
                             CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                             (size_type)in_stack_fffffffffffffbb8,(value_type_conflict1 *)0x44831c);
                  for (local_234 = 0; local_234 < local_274; local_234 = local_234 + 1) {
                    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                                       ((vector<double,_std::allocator<double>_> *)(local_240 + 2),
                                        (long)local_234);
                    std::istream::operator>>(&local_230,pvVar4);
                  }
                  std::getline<char,std::char_traits<char>,std::allocator<char>>
                            (&local_230,local_270);
                  while( true ) {
                    trim((string *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                         in_stack_fffffffffffffbb8);
                    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)CONCAT17(in_stack_fffffffffffffbc7,
                                                        in_stack_fffffffffffffbc0),
                                            (char *)in_stack_fffffffffffffbb8);
                    local_3b2 = false;
                    if (bVar2) {
                      local_3b2 = std::ios::operator_cast_to_bool
                                            (local_230._vptr_basic_istream[-3] +
                                             (long)&local_230._vptr_basic_istream);
                    }
                    if (local_3b2 == false) break;
                    std::getline<char,std::char_traits<char>,std::allocator<char>>
                              (&local_230,local_270);
                  }
                  trim((string *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                       in_stack_fffffffffffffbb8);
                  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)CONCAT17(in_stack_fffffffffffffbc7,
                                                      in_stack_fffffffffffffbc0),
                                          (char *)in_stack_fffffffffffffbb8);
                  if (bVar2) {
                    std::istream::operator>>(&local_230,&local_280);
                    if (local_280 != 0) {
                      local_2a1 = 0;
                      std::vector<HighsVarType,_std::allocator<HighsVarType>_>::resize
                                (in_stack_fffffffffffffbf0,
                                 CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
                                 (value_type *)in_stack_fffffffffffffbe0);
                      for (local_234 = 0; local_234 < local_280; local_234 = local_234 + 1) {
                        std::istream::operator>>(&local_230,&local_2a8);
                        if ((local_281 & 1) != 0) {
                          local_2a8 = local_2a8 + -1;
                        }
                        pvVar5 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::
                                 operator[]((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
                                            (local_240 + 0x5e),(long)local_2a8);
                        *pvVar5 = kInteger;
                      }
                    }
                    std::getline<char,std::char_traits<char>,std::allocator<char>>
                              (&local_230,local_270);
                    while( true ) {
                      trim((string *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                           in_stack_fffffffffffffbb8);
                      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)CONCAT17(in_stack_fffffffffffffbc7,
                                                          in_stack_fffffffffffffbc0),
                                              (char *)in_stack_fffffffffffffbb8);
                      local_3d2 = false;
                      if (bVar2) {
                        local_3d2 = std::ios::operator_cast_to_bool
                                              (local_230._vptr_basic_istream[-3] +
                                               (long)&local_230._vptr_basic_istream);
                      }
                      if (local_3d2 == false) break;
                      std::getline<char,std::char_traits<char>,std::allocator<char>>
                                (&local_230,local_270);
                    }
                  }
                  trim((string *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                       in_stack_fffffffffffffbb8);
                  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)CONCAT17(in_stack_fffffffffffffbc7,
                                                      in_stack_fffffffffffffbc0),
                                          (char *)in_stack_fffffffffffffbb8);
                  if (bVar2) {
                    std::ifstream::close();
                    HighsLp::ensureColwise((HighsLp *)0x448661);
                  }
                  trim((string *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                       in_stack_fffffffffffffbb8);
                  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)CONCAT17(in_stack_fffffffffffffbc7,
                                                      in_stack_fffffffffffffbc0),
                                          (char *)in_stack_fffffffffffffbb8);
                  if (bVar2) {
                    std::getline<char,std::char_traits<char>,std::allocator<char>>
                              (&local_230,local_270);
                    trim((string *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                         in_stack_fffffffffffffbb8);
                    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)CONCAT17(in_stack_fffffffffffffbc7,
                                                        in_stack_fffffffffffffbc0),
                                            (char *)in_stack_fffffffffffffbb8);
                    if (bVar2) {
                      std::getline<char,std::char_traits<char>,std::allocator<char>>
                                (&local_230,local_270);
                    }
                    trim((string *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                         in_stack_fffffffffffffbb8);
                    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)CONCAT17(in_stack_fffffffffffffbc7,
                                                        in_stack_fffffffffffffbc0),
                                            (char *)in_stack_fffffffffffffbb8);
                    if (bVar2) {
                      local_4 = kParserError;
                      local_288 = 1;
                    }
                    else {
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
                      for (local_234 = 0; local_234 < local_274; local_234 = local_234 + 1) {
                        std::getline<char,std::char_traits<char>,std::allocator<char>>
                                  (&local_230,local_270);
                        psVar6 = trim((string *)
                                      CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                                      in_stack_fffffffffffffbb8);
                        pvVar7 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               *)(local_240 + 0x52),(long)local_234);
                        std::__cxx11::string::operator=((string *)pvVar7,(string *)psVar6);
                      }
                      std::getline<char,std::char_traits<char>,std::allocator<char>>
                                (&local_230,local_270);
                      trim((string *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                           in_stack_fffffffffffffbb8);
                      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)CONCAT17(in_stack_fffffffffffffbc7,
                                                          in_stack_fffffffffffffbc0),
                                              (char *)in_stack_fffffffffffffbb8);
                      if (bVar2) {
                        local_4 = kParserError;
                        local_288 = 1;
                      }
                      else {
                        for (local_234 = 0; local_234 < local_278; local_234 = local_234 + 1) {
                          std::getline<char,std::char_traits<char>,std::allocator<char>>
                                    (&local_230,local_270);
                          psVar6 = trim((string *)
                                        CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0
                                                ),in_stack_fffffffffffffbb8);
                          pvVar7 = std::
                                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 *)(local_240 + 0x58),(long)local_234);
                          std::__cxx11::string::operator=((string *)pvVar7,(string *)psVar6);
                        }
                        std::ifstream::close();
                        local_288 = 0;
                      }
                    }
                  }
                  else {
                    bVar1 = std::ios::operator!(local_230._vptr_basic_istream[-3] +
                                                (long)&local_230._vptr_basic_istream);
                    if ((bVar1 & 1) != 0) {
                      HighsLp::ensureColwise((HighsLp *)0x448969);
                    }
                    highsLogUser((HighsLogOptions *)(local_18 + 0x380),kError,
                                 "names not found in EMS file\n");
                    local_4 = kParserError;
                    local_288 = 1;
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      highsLogUser((HighsLogOptions *)(local_18 + 0x380),kError,"n_rows not found in EMS file\n");
      local_4 = kParserError;
      local_288 = 1;
    }
    std::__cxx11::string::~string(local_270);
    if (local_288 == 0) {
      HighsLp::ensureColwise((HighsLp *)0x448a28);
      local_4 = kOk;
      local_288 = 1;
    }
  }
  std::ifstream::~ifstream(&local_230);
  return local_4;
}

Assistant:

FilereaderRetcode FilereaderEms::readModelFromFile(const HighsOptions& options,
                                                   const std::string filename,
                                                   HighsModel& model) {
  std::ifstream f;
  HighsInt i;

  HighsLp& lp = model.lp_;
  f.open(filename, std::ios::in);
  if (f.is_open()) {
    std::string line;
    HighsInt numCol, numRow, AcountX, num_int;
    bool indices_from_one = false;

    // counts
    std::getline(f, line);
    if (trim(line) != "n_rows") {
      while (trim(line) != "n_rows" && f) std::getline(f, line);
      indices_from_one = true;
    }
    if (!f) {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "n_rows not found in EMS file\n");
      return FilereaderRetcode::kParserError;
    }
    f >> numRow;

    std::getline(f, line);
    while (trim(line) == "") std::getline(f, line);
    if (trim(line) != "n_columns") {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "n_columns not found in EMS file\n");
      return FilereaderRetcode::kParserError;
    }
    f >> numCol;

    std::getline(f, line);
    while (trim(line) == "") std::getline(f, line);
    if (trim(line) != "n_matrix_elements") {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "n_matrix_elements not found in EMS file\n");
      return FilereaderRetcode::kParserError;
    }
    f >> AcountX;

    lp.num_col_ = numCol;
    lp.num_row_ = numRow;

    // matrix
    std::getline(f, line);
    while (trim(line) == "") std::getline(f, line);
    if (trim(line) != "matrix") {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "matrix not found in EMS file\n");
      return FilereaderRetcode::kParserError;
    }
    lp.a_matrix_.format_ = MatrixFormat::kColwise;
    lp.a_matrix_.start_.resize(numCol + 1);
    lp.a_matrix_.index_.resize(AcountX);
    lp.a_matrix_.value_.resize(AcountX);

    for (i = 0; i < numCol + 1; i++) {
      f >> lp.a_matrix_.start_[i];
      if (indices_from_one) lp.a_matrix_.start_[i]--;
    }

    for (i = 0; i < AcountX; i++) {
      f >> lp.a_matrix_.index_[i];
      if (indices_from_one) lp.a_matrix_.index_[i]--;
    }

    for (i = 0; i < AcountX; i++) f >> lp.a_matrix_.value_[i];

    // cost and bounds
    std::getline(f, line);
    while (trim(line) == "") std::getline(f, line);
    if (trim(line) != "column_bounds") {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "column_bounds not found in EMS file\n");
      return FilereaderRetcode::kParserError;
    }
    lp.col_lower_.reserve(numCol);
    lp.col_upper_.reserve(numCol);

    lp.col_lower_.assign(numCol, -kHighsInf);
    lp.col_upper_.assign(numCol, kHighsInf);

    for (i = 0; i < numCol; i++) {
      f >> lp.col_lower_[i];
    }

    for (i = 0; i < numCol; i++) {
      f >> lp.col_upper_[i];
    }

    std::getline(f, line);
    while (trim(line) == "") std::getline(f, line);
    if (trim(line) != "row_bounds") {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "row_bounds not found in EMS file\n");
      return FilereaderRetcode::kParserError;
    }
    lp.row_lower_.reserve(numRow);
    lp.row_upper_.reserve(numRow);
    lp.row_lower_.assign(numRow, -kHighsInf);
    lp.row_upper_.assign(numRow, kHighsInf);

    for (i = 0; i < numRow; i++) {
      f >> lp.row_lower_[i];
    }

    for (i = 0; i < numRow; i++) {
      f >> lp.row_upper_[i];
    }

    std::getline(f, line);
    while (trim(line) == "") std::getline(f, line);
    if (trim(line) != "column_costs") {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "column_costs not found in EMS file\n");
      return FilereaderRetcode::kParserError;
    }
    lp.col_cost_.reserve(numCol);
    lp.col_cost_.assign(numCol, 0);
    for (i = 0; i < numCol; i++) {
      f >> lp.col_cost_[i];
    }

    // Get the next keyword
    std::getline(f, line);
    while (trim(line) == "" && f) std::getline(f, line);

    if (trim(line) == "integer_columns") {
      f >> num_int;
      if (num_int) {
        lp.integrality_.resize(lp.num_col_, HighsVarType::kContinuous);
        HighsInt iCol;
        for (i = 0; i < num_int; i++) {
          f >> iCol;
          if (indices_from_one) iCol--;
          lp.integrality_[iCol] = HighsVarType::kInteger;
        }
      }
      // Get the next keyword. If there's no integer_columns section
      // then it will already have been read
      std::getline(f, line);
      while (trim(line) == "" && f) std::getline(f, line);
    }

    // Act if the next keyword is end_linear
    if (trim(line) == "end_linear") {
      // File read completed OK
      f.close();
      lp.ensureColwise();
    }

    // Act if the next keyword is names
    if (trim(line) == "names") {
      // Ignore length since we support any length.
      std::getline(f, line);
      if (trim(line) != "columns") std::getline(f, line);
      if (trim(line) != "columns") return FilereaderRetcode::kParserError;

      lp.row_names_.resize(numRow);
      lp.col_names_.resize(numCol);

      for (i = 0; i < numCol; i++) {
        std::getline(f, line);
        lp.col_names_[i] = trim(line);
      }

      std::getline(f, line);
      if (trim(line) != "rows") return FilereaderRetcode::kParserError;

      for (i = 0; i < numRow; i++) {
        std::getline(f, line);
        lp.row_names_[i] = trim(line);
      }
    } else {
      // OK if file just ends after the integer_columns section without
      // end_linear
      if (!f) lp.ensureColwise();
      highsLogUser(options.log_options, HighsLogType::kError,
                   "names not found in EMS file\n");
      return FilereaderRetcode::kParserError;
    }
    f.close();
  } else {
    highsLogUser(options.log_options, HighsLogType::kError,
                 "EMS file not found\n");
    return FilereaderRetcode::kFileNotFound;
  }
  lp.ensureColwise();
  return FilereaderRetcode::kOk;
}